

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O3

void __thiscall
njoy::ENDFtk::ListRecord::print<std::back_insert_iterator<std::__cxx11::string>>
          (ListRecord *this,
          back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *it,int MAT,int MF,int MT)

{
  long lVar1;
  int iVar2;
  double dVar3;
  double *source;
  long lVar4;
  int MT_local;
  int MF_local;
  int MAT_local;
  double local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  local_58 = (this->metadata).fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
             super__Head_base<1UL,_double,_false>._M_head_impl;
  local_40 = (this->metadata).fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
             super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
             _M_head_impl;
  local_48 = (this->metadata).fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
             super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>
             .super__Head_base<3UL,_long,_false>._M_head_impl;
  local_50 = (long)(this->data).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->data).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
  local_38 = *(long *)&(this->metadata).fields.
                       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                       super__Tuple_impl<2UL,_long,_long,_long,_long>.
                       super__Tuple_impl<3UL,_long,_long,_long>.super__Tuple_impl<4UL,_long,_long>;
  MT_local = MT;
  MF_local = MF;
  MAT_local = MAT;
  tools::disco::ENDF::write<double,std::back_insert_iterator<std::__cxx11::string>>
            ((this->metadata).fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Head_base<0UL,_double,_false>._M_head_impl,it);
  tools::disco::ENDF::write<double,std::back_insert_iterator<std::__cxx11::string>>(local_58,it);
  tools::disco::Integer<11u>::write<long,std::back_insert_iterator<std::__cxx11::string>>
            (&local_40,it);
  tools::disco::
  Record<njoy::tools::disco::Integer<11u>,njoy::tools::disco::Integer<11u>,njoy::tools::disco::Integer<11u>,njoy::tools::disco::Integer<4u>,njoy::tools::disco::Integer<2u>,njoy::tools::disco::Integer<3u>,njoy::tools::disco::Column<5u>>
  ::write<std::back_insert_iterator<std::__cxx11::string>,long,long,long,int,int,int>
            (it,&local_48,&local_50,&local_38,&MAT_local,&MF_local,&MT_local);
  source = (this->data).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar1 = (long)(this->data).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)source >> 3;
  lVar4 = lVar1 / 6;
  dVar3 = (double)(lVar1 % 6);
  if (10 < lVar1 + 5U) {
    local_58 = (double)(lVar1 % 6);
    do {
      tools::disco::
      Record<njoy::tools::disco::ENDF,njoy::tools::disco::ENDF,njoy::tools::disco::ENDF,njoy::tools::disco::ENDF,njoy::tools::disco::ENDF,njoy::tools::disco::ENDF,njoy::tools::disco::Integer<4u>,njoy::tools::disco::Integer<2u>,njoy::tools::disco::Integer<3u>,njoy::tools::disco::Column<5u>>
      ::
      write<std::back_insert_iterator<std::__cxx11::string>,double,double,double,double,double,double,int,int,int>
                (it,source,source + 1,source + 2,source + 3,source + 4,source + 5,&MAT_local,
                 &MF_local,&MT_local);
      source = source + 6;
      lVar4 = lVar4 + -1;
      dVar3 = local_58;
    } while (lVar4 != 0);
  }
  if (dVar3 != 0.0) {
    do {
      tools::disco::ENDF::write<double,std::back_insert_iterator<std::__cxx11::string>>(*source,it);
      source = source + 1;
    } while (source != (this->data).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish);
    if (dVar3 != 2.96439387504748e-323) {
      lVar4 = 6 - (long)dVar3;
      do {
        iVar2 = 0xb;
        do {
          std::__cxx11::string::push_back((char)it->container);
          iVar2 = iVar2 + -1;
        } while (iVar2 != 0);
        lVar4 = lVar4 + -1;
      } while (lVar4 != 0);
    }
    tools::disco::
    Record<njoy::tools::disco::Integer<4u>,njoy::tools::disco::Integer<2u>,njoy::tools::disco::Integer<3u>,njoy::tools::disco::Column<5u>>
    ::write<std::back_insert_iterator<std::__cxx11::string>,int,int,int>
              (it,&MAT_local,&MF_local,&MT_local);
  }
  return;
}

Assistant:

void print( OutputIterator& it, int MAT, int MF, int MT ) const {

  using namespace njoy::tools;
  {
    using Format = disco::Record< disco::ENDF, disco::ENDF,
                                  disco::Integer< 11 >, disco::Integer< 11 >,
                                  disco::Integer< 11 >, disco::Integer< 11 >,
                                  disco::Integer< 4 >, disco::Integer< 2 >,
                                  disco::Integer< 3 >, disco::Column<5> >;
    Format::write( it,
                   this->C1(), this->C2(),
                   this->L1(), this->L2(),
                   this->NPL(), this->N2(),
                   MAT, MF, MT );
  }{
    using Format = disco::Record< disco::ENDF, disco::ENDF,
                                  disco::ENDF, disco::ENDF,
                                  disco::ENDF, disco::ENDF,
                                  disco::Integer< 4 >, disco::Integer< 2 >,
                                  disco::Integer< 3 >, disco::Column<5> >;

    auto nFullLines = this->NPL() / 6;
    auto partialLineEntries = this->NPL() - nFullLines * 6;

    auto entry = this->list().begin();

    for ( ; nFullLines-- != 0; entry += 6 ){
      Format::write( it,
                     entry[0], entry[1], entry[2],
                     entry[3], entry[4], entry[5],
                     MAT, MF, MT );
    }

    if ( partialLineEntries ){
      do {
        disco::ENDF::write( *entry, it );
      } while( ++entry != this->list().end() );

      auto blankEntries = 6 - partialLineEntries;

      while ( blankEntries-- ){ disco::Column< 11 >::write( it ); }

      using Format =
        disco::Record< disco::Integer< 4 >, disco::Integer< 2 >,
                       disco::Integer< 3 >, disco::Column< 5 > >;

      Format::write( it, MAT, MF, MT );
    }
  }
}